

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_common.c
# Opt level: O2

lzma_ret lzma_delta_coder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters)

{
  void *options;
  lzma_ret lVar1;
  lzma_next_coder *next_00;
  uint64_t uVar2;
  
  next_00 = (lzma_next_coder *)next->coder;
  if (next_00 == (lzma_next_coder *)0x0) {
    next_00 = (lzma_next_coder *)lzma_alloc(0x158,allocator);
    if (next_00 == (lzma_next_coder *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = next_00;
    next->end = delta_coder_end;
    next_00->coder = (void *)0x0;
    next_00->id = 0xffffffffffffffff;
    next_00->init = 0;
    next_00->code = (lzma_code_function)0x0;
    next_00->end = (lzma_end_function)0x0;
    next_00->get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
    next_00->get_check = (_func_lzma_check_void_ptr *)0x0;
    next_00->memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
    next_00->update =
         (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
  }
  options = filters->options;
  uVar2 = lzma_delta_coder_memusage(options);
  if (uVar2 == 0xffffffffffffffff) {
    return LZMA_OPTIONS_ERROR;
  }
  next_00[1].coder = (void *)(ulong)*(uint *)((long)options + 4);
  memset(&next_00[1].id,0,0x101);
  lVar1 = lzma_next_filter_init(next_00,allocator,filters + 1);
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_delta_coder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter_info *filters)
{
	// Allocate memory for the decoder if needed.
	lzma_delta_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_delta_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;

		// End function is the same for encoder and decoder.
		next->end = &delta_coder_end;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Validate the options.
	if (lzma_delta_coder_memusage(filters[0].options) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// Set the delta distance.
	const lzma_options_delta *opt = filters[0].options;
	coder->distance = opt->dist;

	// Initialize the rest of the variables.
	coder->pos = 0;
	memzero(coder->history, LZMA_DELTA_DIST_MAX);

	// Initialize the next decoder in the chain, if any.
	return lzma_next_filter_init(&coder->next, allocator, filters + 1);
}